

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::Instruction::GetSingleWordOperand(Instruction *this,uint32_t index)

{
  uint **ppuVar1;
  Operand *pOVar2;
  size_t sVar3;
  uint **ppuVar4;
  
  pOVar2 = GetOperand(this,index);
  sVar3 = utils::SmallVector<unsigned_int,_2UL>::size(&pOVar2->words);
  if (sVar3 == 1) {
    ppuVar1 = (uint **)(pOVar2->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar4 = &(pOVar2->words).small_data_;
    if (ppuVar1 != (uint **)0x0) {
      ppuVar4 = ppuVar1;
    }
    return **ppuVar4;
  }
  __assert_fail("words.size() == 1 && \"expected the operand only taking one word\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp"
                ,0xb3,"uint32_t spvtools::opt::Instruction::GetSingleWordOperand(uint32_t) const");
}

Assistant:

uint32_t Instruction::GetSingleWordOperand(uint32_t index) const {
  const auto& words = GetOperand(index).words;
  assert(words.size() == 1 && "expected the operand only taking one word");
  return words.front();
}